

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-updating.h
# Opt level: O2

void __thiscall wasm::TypeMapper::map(TypeMapper *this)

{
  GlobalTypeRewriter::mapTypes(&this->super_GlobalTypeRewriter,this->mapping);
  GlobalTypeRewriter::update(&this->super_GlobalTypeRewriter);
  return;
}

Assistant:

void map() {
    // Map the types of expressions (curr->type, etc.) to their merged
    // types.
    mapTypes(mapping);

    // Update the internals of types (struct fields, signatures, etc.) to
    // refer to the merged types.
    update();
  }